

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

bool __thiscall QPlainTextEdit::event(QPlainTextEdit *this,QEvent *e)

{
  ushort uVar1;
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *pQVar2;
  qreal qVar3;
  bool bVar4;
  LayoutDirection LVar5;
  int iVar6;
  int iVar7;
  GestureState GVar8;
  int iVar9;
  QPalette *pal;
  QPanGesture *this_01;
  QScrollBar *pQVar10;
  QScrollBar *this_02;
  long lVar11;
  long lVar12;
  QPlainTextEditPrivate *d;
  long in_FS_OFFSET;
  double dVar13;
  QRect QVar14;
  QPointF QVar15;
  QPoint cursorPos;
  QContextMenuEvent ce;
  QPoint local_88;
  QPoint local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  uVar1 = *(ushort *)(e + 8);
  if (uVar1 < 0x52) {
    if (uVar1 - 0x18 < 2) {
      pQVar2 = this_00->control;
      pal = QWidget::palette((QWidget *)this);
      QWidgetTextControl::setPalette((QWidgetTextControl *)pQVar2,pal);
    }
    else if (uVar1 == 0x33) {
LAB_004a098a:
      pQVar2 = this_00->control;
      LVar5 = QWidget::layoutDirection
                        (*(QWidget **)
                          &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                           super_QWidgetPrivate.field_0x8);
      pQVar10 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
      if (LVar5 == RightToLeft) {
        iVar6 = QAbstractSlider::maximum(&pQVar10->super_QAbstractSlider);
        iVar7 = QAbstractSlider::value
                          (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->
                            super_QAbstractSlider);
        iVar6 = iVar6 - iVar7;
      }
      else {
        iVar6 = QAbstractSlider::value(&pQVar10->super_QAbstractSlider);
      }
      qVar3 = QPlainTextEditPrivate::verticalOffset
                        (this_00,this_00->control->topBlock,this_00->topLine);
      local_78._8_8_ = qVar3 + this_00->topLineFracture;
      local_78._0_8_ = (undefined1 *)(double)iVar6;
      QWidgetTextControl::processEvent
                ((QWidgetTextControl *)pQVar2,e,(QPointF *)local_78,
                 (this_00->super_QAbstractScrollAreaPrivate).viewport);
    }
  }
  else {
    if (uVar1 == 0xc6) {
      this_01 = (QPanGesture *)QGestureEvent::gesture((QGestureEvent *)e,PanGesture);
      bVar4 = true;
      if (this_01 != (QPanGesture *)0x0) {
        pQVar10 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
        this_02 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
        GVar8 = QGesture::state((QGesture *)this_01);
        if (GVar8 == GestureStarted) {
          iVar6 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
          this_00->originalOffsetY = iVar6;
        }
        QVar15 = QPanGesture::offset(this_01);
        dVar13 = QVar15.yp;
        if ((((QVar15.xp != 0.0) || (NAN(QVar15.xp))) || (dVar13 != 0.0)) || (NAN(dVar13))) {
          QGuiApplication::layoutDirection();
          local_80 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          QWidgetTextControl::document
                    (*(QWidgetTextControl **)
                      (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                 field_0x8 + 800));
          QTextDocument::defaultFont();
          QFontMetrics::QFontMetrics((QFontMetrics *)&local_80,(QFont *)local_78);
          QFont::~QFont((QFont *)local_78);
          iVar7 = QFontMetrics::height();
          iVar9 = QAbstractSlider::value(&pQVar10->super_QAbstractSlider);
          QVar15 = QPanGesture::delta(this_01);
          iVar6 = this_00->originalOffsetY;
          QAbstractSlider::setValue
                    (&pQVar10->super_QAbstractSlider,(int)((double)iVar9 - QVar15.xp));
          QAbstractSlider::setValue
                    (&this_02->super_QAbstractSlider,(int)((double)iVar6 - dVar13 / (double)iVar7));
          QFontMetrics::~QFontMetrics((QFontMetrics *)&local_80);
        }
      }
      goto LAB_004a0b68;
    }
    if (uVar1 == 0x6e) goto LAB_004a098a;
    if ((uVar1 == 0x52) && (e[0x38] == (QEvent)0x1)) {
      QPlainTextEditPrivate::ensureCursorVisible(this_00,(bool)((this_00->field_0x348 & 8) >> 3));
      local_80 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QVar14 = cursorRect(this);
      lVar12 = (long)QVar14.x2.m_i.m_i + (long)QVar14.x1.m_i.m_i;
      lVar11 = (QVar14._8_8_ >> 0x20) + (QVar14._0_8_ >> 0x20);
      local_80 = (QPoint)((ulong)(lVar12 - (lVar12 >> 0x3f)) >> 1 & 0xffffffff |
                         (lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffeU) << 0x1f);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = QWidget::mapToGlobal
                           ((this_00->super_QAbstractScrollAreaPrivate).viewport,&local_80);
      QContextMenuEvent::QContextMenuEvent((QContextMenuEvent *)local_78,1,&local_80,&local_88,0);
      local_78[0xc] = e[0xc];
      bVar4 = QAbstractScrollArea::event((QAbstractScrollArea *)this,(QEvent *)local_78);
      (**(code **)(*(long *)e + 0x10))(e,local_78[0xc]);
      QContextMenuEvent::~QContextMenuEvent((QContextMenuEvent *)local_78);
      goto LAB_004a0b68;
    }
  }
  bVar4 = QAbstractScrollArea::event((QAbstractScrollArea *)this,e);
LAB_004a0b68:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QPlainTextEdit::event(QEvent *e)
{
    Q_D(QPlainTextEdit);

    switch (e->type()) {
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard) {
            ensureCursorVisible();
            const QPoint cursorPos = cursorRect().center();
            QContextMenuEvent ce(QContextMenuEvent::Keyboard, cursorPos, d->viewport->mapToGlobal(cursorPos));
            ce.setAccepted(e->isAccepted());
            const bool result = QAbstractScrollArea::event(&ce);
            e->setAccepted(ce.isAccepted());
            return result;
        }
        break;
#endif // QT_NO_CONTEXTMENU
    case QEvent::ShortcutOverride:
    case QEvent::ToolTip:
        d->sendControlEvent(e);
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled())
            d->sendControlEvent(e);
        break;
#endif
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
        if (auto *g = static_cast<QGestureEvent *>(e)->gesture(Qt::PanGesture)) {
            QPanGesture *panGesture = static_cast<QPanGesture *>(g);
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            if (panGesture->state() == Qt::GestureStarted)
                d->originalOffsetY = vBar->value();
            QPointF offset = panGesture->offset();
            if (!offset.isNull()) {
                if (QGuiApplication::isRightToLeft())
                    offset.rx() *= -1;
                // QPlainTextEdit scrolls by lines only in vertical direction
                QFontMetrics fm(document()->defaultFont());
                int lineHeight = fm.height();
                int newX = hBar->value() - panGesture->delta().x();
                int newY = d->originalOffsetY - offset.y()/lineHeight;
                hBar->setValue(newX);
                vBar->setValue(newY);
            }
        }
        return true;
#endif // QT_NO_GESTURES
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        d->control->setPalette(palette());
        break;
    default:
        break;
    }
    return QAbstractScrollArea::event(e);
}